

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

size_t ra_portable_deserialize_size(char *buf,size_t maxbytes)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  size_t containersize_2;
  size_t containersize_1;
  uint16_t n_runs;
  size_t containersize;
  _Bool isrun;
  _Bool isbitmap;
  uint32_t thiscard;
  uint16_t tmp;
  int32_t k;
  uint16_t *keyscards;
  int32_t s;
  _Bool hasrun;
  char *bitmapOfRunContainers;
  int32_t size;
  uint32_t cookie;
  size_t bytestotal;
  size_t maxbytes_local;
  char *buf_local;
  size_t local_8;
  
  bytestotal = 4;
  if (maxbytes < 4) {
    local_8 = 0;
  }
  else {
    uVar1 = *(uint *)buf;
    buf_local = buf + 4;
    if (((uVar1 & 0xffff) == 0x303b) || (uVar1 == 0x303a)) {
      if ((uVar1 & 0xffff) == 0x303b) {
        size = (uVar1 >> 0x10) + 1;
      }
      else {
        bytestotal = 8;
        if (maxbytes < 8) {
          return 0;
        }
        size = *(int32_t *)buf_local;
        buf_local = buf + 8;
      }
      if (size < 0x10001) {
        bitmapOfRunContainers = (char *)0x0;
        bVar5 = (uVar1 & 0xffff) == 0x303b;
        if (bVar5) {
          iVar3 = (size + 7) / 8;
          bytestotal = (long)iVar3 + bytestotal;
          if (maxbytes < bytestotal) {
            return 0;
          }
          bitmapOfRunContainers = buf_local;
          buf_local = buf_local + iVar3;
        }
        pcVar2 = buf_local;
        bytestotal = (long)(size << 1) * 2 + bytestotal;
        if (maxbytes < bytestotal) {
          local_8 = 0;
        }
        else {
          buf_local = buf_local + (long)(size << 1) * 2;
          if ((!bVar5) || (3 < size)) {
            bytestotal = (long)(size << 2) + bytestotal;
            if (maxbytes < bytestotal) {
              return 0;
            }
            buf_local = buf_local + (size << 2);
          }
          for (k = 0; k < size; k = k + 1) {
            isbitmap = 0x1000 < *(ushort *)(pcVar2 + (long)(k << 1) * 2 + 2) + 1;
            bVar6 = false;
            if (bVar5) {
              bVar6 = ((int)bitmapOfRunContainers[k / 8] & 1 << ((byte)((long)k % 8) & 0x1f)) != 0;
              isbitmap = !bVar6 && isbitmap;
            }
            if (isbitmap) {
              bytestotal = bytestotal + 0x2000;
              if (maxbytes < bytestotal) {
                return 0;
              }
              buf_local = buf_local + 0x2000;
            }
            else if (bVar6) {
              if (maxbytes < bytestotal + 2) {
                return 0;
              }
              bytestotal = (ulong)*(ushort *)buf_local * 4 + bytestotal + 2;
              if (maxbytes < bytestotal) {
                return 0;
              }
              buf_local = buf_local + (ulong)*(ushort *)buf_local * 4 + 2;
            }
            else {
              lVar4 = (ulong)(*(ushort *)(pcVar2 + (long)(k << 1) * 2 + 2) + 1) * 2;
              bytestotal = lVar4 + bytestotal;
              if (maxbytes < bytestotal) {
                return 0;
              }
              buf_local = buf_local + lVar4;
            }
          }
          local_8 = bytestotal;
        }
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t ra_portable_deserialize_size(const char *buf, const size_t maxbytes) {
    size_t bytestotal = sizeof(int32_t);  // for cookie
    if (bytestotal > maxbytes) return 0;
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        return 0;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        bytestotal += sizeof(int32_t);
        if (bytestotal > maxbytes) return 0;
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1 << 16)) {
        return 0;
    }
    char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        bytestotal += s;
        if (bytestotal > maxbytes) return 0;
        bitmapOfRunContainers = (char *)buf;
        buf += s;
    }
    bytestotal += size * 2 * sizeof(uint16_t);
    if (bytestotal > maxbytes) return 0;
    uint16_t *keyscards = (uint16_t *)buf;
    buf += size * 2 * sizeof(uint16_t);
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        // skipping the offsets
        bytestotal += size * 4;
        if (bytestotal > maxbytes) return 0;
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else if (isrun) {
            bytestotal += sizeof(uint16_t);
            if (bytestotal > maxbytes) return 0;
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            buf += sizeof(uint16_t);
            size_t containersize = n_runs * sizeof(rle16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else {
            size_t containersize = thiscard * sizeof(uint16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        }
    }
    return bytestotal;
}